

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

void __thiscall asmjit::v1_14::Zone::reset(Zone *this,ResetPolicy resetPolicy)

{
  Zone ZVar1;
  void *__ptr;
  void *pvVar2;
  long lVar3;
  undefined8 *__ptr_00;
  undefined8 *puVar4;
  bool bVar5;
  
  __ptr_00 = *(undefined8 **)(this + 0x10);
  if (__ptr_00 != (undefined8 *)_zeroBlock) {
    if (resetPolicy == kHard) {
      ZVar1 = this[0x1b];
      *(char **)this =
           "/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
      ;
      *(char **)(this + 8) =
           "/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
      ;
      *(undefined1 **)(this + 0x10) = _zeroBlock;
      *(ulong *)(this + 0x20) = (ulong)(ZVar1 != (Zone)0x0);
      __ptr = (void *)__ptr_00[1];
      do {
        puVar4 = (undefined8 *)*__ptr_00;
        bVar5 = puVar4 == (undefined8 *)0x0;
        if (bVar5 && ZVar1 != (Zone)0x0) {
          *__ptr_00 = 0;
          __ptr_00[1] = 0;
          lVar3 = 1L << ((byte)this[0x18] & 0x3f);
          *(long *)this = -lVar3 & (long)__ptr_00 + lVar3 + 0x17;
          *(long *)(this + 8) = (long)__ptr_00 + __ptr_00[2] + 0x18;
          *(undefined8 **)(this + 0x10) = __ptr_00;
          puVar4 = __ptr_00;
        }
        else {
          free(__ptr_00);
        }
        __ptr_00 = puVar4;
      } while ((bool)(~(bVar5 && ZVar1 != (Zone)0x0) & puVar4 != (undefined8 *)0x0));
      while (__ptr != (void *)0x0) {
        pvVar2 = *(void **)((long)__ptr + 8);
        free(__ptr);
        __ptr = pvVar2;
      }
    }
    else {
      do {
        puVar4 = __ptr_00;
        __ptr_00 = (undefined8 *)*puVar4;
      } while ((undefined8 *)*puVar4 != (undefined8 *)0x0);
      lVar3 = 1L << ((byte)this[0x18] & 0x3f);
      *(long *)this = -lVar3 & (long)puVar4 + lVar3 + 0x17;
      *(long *)(this + 8) = (long)puVar4 + puVar4[2] + 0x18;
      *(undefined8 **)(this + 0x10) = puVar4;
    }
  }
  return;
}

Assistant:

void Zone::reset(ResetPolicy resetPolicy) noexcept {
  Block* cur = _block;

  // Can't be altered.
  if (cur == &_zeroBlock) {
    return;
  }

  if (resetPolicy == ResetPolicy::kHard) {
    bool hasStatic = hasStaticBlock();
    Block* initial = const_cast<Zone::Block*>(&_zeroBlock);

    _ptr = initial->data();
    _end = initial->data();
    _block = initial;
    _blockCount = size_t(hasStatic);

    // Since cur can be in the middle of the double-linked list, we have to traverse both directions (`prev` and
    // `next`) separately to visit all.
    Block* next = cur->next;
    do {
      Block* prev = cur->prev;

      if (prev == nullptr && hasStatic) {
        // If this is the first block and this Zone is actually a ZoneTmp then the first block cannot be freed.
        cur->prev = nullptr;
        cur->next = nullptr;
        Zone_assignBlock(this, cur);
        break;
      }

      ::free(cur);
      cur = prev;
    } while (cur);

    cur = next;
    while (cur) {
      next = cur->next;
      ::free(cur);
      cur = next;
    }
  }
  else {
    while (cur->prev) {
      cur = cur->prev;
    }
    Zone_assignBlock(this, cur);
  }
}